

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisCircularDependencies.cpp
# Opt level: O0

void __thiscall
TestFindCircularDependenciesSeesNoCycleAfterDroppingOneComponent::
TestFindCircularDependenciesSeesNoCycleAfterDroppingOneComponent
          (TestFindCircularDependenciesSeesNoCycleAfterDroppingOneComponent *this)

{
  Test *in_RDI;
  
  Test::Test(in_RDI,"FindCircularDependenciesSeesNoCycleAfterDroppingOneComponent");
  in_RDI->_vptr_Test = (_func_int **)&PTR_Run_0018f608;
  return;
}

Assistant:

TEST(FindCircularDependenciesSeesNoCycleAfterDroppingOneComponent) {
  std::unordered_map<std::string, Component *> components;
  Component* a = components["a"] = new Component("a");
  Component* b = components["b"] = new Component("b");
  Component* c = components["c"] = new Component("c");
  Component* d = components["d"] = new Component("d");
  Component* e = components["e"] = new Component("e");
  a->pubDeps.insert(b);
  b->privDeps.insert(c);
  c->pubDeps.insert(d);
  d->privDeps.insert(e);
  e->pubDeps.insert(a);

  FindCircularDependencies(components);
  KillComponent(components, "a");
  ASSERT(NodesWithCycles(components) == 0);
}